

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

bool __thiscall pg::PSISolver::si_val_less(PSISolver *this,int a,int b)

{
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  int b_i;
  int a_i;
  int i;
  int *b_val;
  int *a_val;
  int b_local;
  int a_local;
  PSISolver *this_local;
  
  if (a == b) {
    this_local._7_1_ = false;
  }
  else if ((a == -1) || ((*(int *)(won + (long)a * 4) == 0 && (*(int *)(done + (long)a * 4) != 2))))
  {
    if ((b == -1) || ((*(int *)(won + (long)b * 4) == 0 && (*(int *)(done + (long)b * 4) != 2)))) {
      if (a == -1) {
        local_48 = 0;
      }
      else {
        local_48 = val + (long)(pg::k * a) * 4;
      }
      if (b == -1) {
        local_50 = 0;
      }
      else {
        local_50 = val + (long)(pg::k * b) * 4;
      }
      for (b_i = pg::k + -1; -1 < b_i; b_i = b_i + -1) {
        if (a == -1) {
          local_54 = 0;
        }
        else {
          local_54 = *(int *)(local_48 + (long)b_i * 4);
        }
        if (b == -1) {
          local_58 = 0;
        }
        else {
          local_58 = *(int *)(local_50 + (long)b_i * 4);
        }
        if (local_54 != local_58) {
          if ((b_i & 1U) != 0) {
            return local_58 < local_54;
          }
          return local_54 < local_58;
        }
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
PSISolver::si_val_less(int a, int b)
{
    // if a == b, then of course return false
    if (a == b) return false;
    // if a is won or on even cycle, then "a >= b"
    if (a != -1 && (won[a] || done[a] == 2)) return false;
    // if b is won or on even cycle and a is not, then "a < b"
    if (b != -1 && (won[b] || done[b] == 2)) return true;
    // neither a/b are won/on even cycle
    int *a_val = a == -1 ? NULL : val + k*a;
    int *b_val = b == -1 ? NULL : val + k*b;
    // find highest priority where they differ
    for (int i=k-1; i>=0; i--) {
        const int a_i = a == -1 ? 0 : a_val[i];
        const int b_i = b == -1 ? 0 : b_val[i];
        if (a_i == b_i) continue;
        if (i&1) return a_i > b_i; // for odd priorities
        else return a_i < b_i;     // for even priorities
    }
    // equal
    return false;
}